

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall
leveldb::DBImpl::RecoverLogFile
          (DBImpl *this,uint64_t log_number,bool last_log,bool *save_manifest,VersionEdit *edit,
          SequenceNumber *max_sequence)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  Writer *this_00;
  MemTable *this_01;
  _func_int **pp_Var7;
  undefined7 in_register_00000011;
  Logger *number;
  ulong *in_stack_00000008;
  uint64_t lfile_size;
  SequentialFile *file;
  string scratch;
  string fname;
  Slice record;
  WriteBatch batch;
  LogReporter reporter;
  Reader reader;
  VersionEdit *local_198;
  undefined1 local_170 [64];
  Env *local_130;
  Logger *local_128;
  string local_120;
  string local_100;
  Slice local_e0;
  undefined1 local_d0 [160];
  
  number = (Logger *)CONCAT71(in_register_00000011,last_log);
  LogFileName(&local_100,(string *)(log_number + 0x898),(uint64_t)number);
  (**(code **)(**(long **)(log_number + 8) + 0x10))
            (this,*(long **)(log_number + 8),&local_100,local_170 + 0x30);
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    local_170._20_4_ = SUB84(save_manifest,0);
    local_d0._32_8_ = &PTR__Reporter_00131240;
    local_d0._40_8_ = *(undefined8 *)(log_number + 8);
    local_d0._48_8_ = *(undefined8 *)(log_number + 0x48);
    local_d0._56_8_ = local_100._M_dataplus._M_p;
    local_d0._64_8_ = (DBImpl *)0x0;
    if (*(char *)(log_number + 0x3a) != '\0') {
      local_d0._64_8_ = this;
    }
    log::Reader::Reader((Reader *)(local_d0 + 0x48),(SequentialFile *)local_170._48_8_,
                        (Reporter *)(local_d0 + 0x20),true,0);
    local_128 = number;
    Log(*(Logger **)(log_number + 0x48),"Recovering log #%llu",number);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    local_120._M_string_length = 0;
    local_120.field_2._M_local_buf[0] = '\0';
    local_e0.data_ = "";
    iVar4 = 0;
    local_e0.size_ = 0;
    WriteBatch::WriteBatch((WriteBatch *)local_d0);
    bVar2 = log::Reader::ReadRecord((Reader *)(local_d0 + 0x48),&local_e0,&local_120);
    pp_Var7 = (this->super_DB)._vptr_DB;
    local_198 = (VersionEdit *)0x0;
    if (pp_Var7 == (_func_int **)0x0 && bVar2) {
      local_170._56_8_ = log_number + 0x10;
      local_198 = (VersionEdit *)0x0;
      iVar4 = 0;
      do {
        sVar6 = local_e0.size_;
        if (local_e0.size_ < (Compressor *)0xc) {
          local_170._0_8_ = "log record too small";
          local_170._8_8_ = (Env *)0x14;
          local_170._24_8_ = "";
          local_170._32_8_ = (_func_int **)0x0;
          Status::Status((Status *)(local_170 + 0x28),kCorruption,(Slice *)local_170,
                         (Slice *)(local_170 + 0x18));
          RecoverLogFile(unsigned_long,bool,bool*,leveldb::VersionEdit*,unsigned_long*)::LogReporter
          ::Corruption(unsigned_long,leveldb::Status_const__
                    (local_d0 + 0x20,sVar6,(Status *)(local_170 + 0x28));
          if ((FilterPolicy *)local_170._40_8_ != (FilterPolicy *)0x0) {
            operator_delete__((void *)local_170._40_8_);
          }
        }
        else {
          WriteBatchInternal::SetContents((WriteBatch *)local_d0,&local_e0);
          if (local_198 == (VersionEdit *)0x0) {
            local_198 = (VersionEdit *)operator_new(0x70);
            MemTable::MemTable((MemTable *)local_198,(InternalKeyComparator *)local_170._56_8_);
            paVar1 = &(local_198->comparator_).field_2;
            *(int *)paVar1 = *(int *)paVar1 + 1;
          }
          WriteBatchInternal::InsertInto((WriteBatch *)local_170,(MemTable *)local_d0);
          pp_Var7 = (this->super_DB)._vptr_DB;
          (this->super_DB)._vptr_DB = (_func_int **)local_170._0_8_;
          local_170._0_8_ = pp_Var7;
          if (pp_Var7 != (_func_int **)0x0) {
            operator_delete__(pp_Var7);
          }
          MaybeIgnoreError((DBImpl *)log_number,(Status *)this);
          pp_Var7 = (this->super_DB)._vptr_DB;
          if (pp_Var7 != (_func_int **)0x0) break;
          local_130 = (Env *)WriteBatchInternal::Sequence((WriteBatch *)local_d0);
          iVar3 = WriteBatchInternal::Count((WriteBatch *)local_d0);
          uVar5 = (long)local_130 + (long)iVar3 + -1;
          if (*in_stack_00000008 < uVar5) {
            *in_stack_00000008 = uVar5;
          }
          sVar6 = MemTable::ApproximateMemoryUsage((MemTable *)local_198);
          if (*(ulong *)(log_number + 0x50) < sVar6) {
            *(undefined1 *)&(edit->comparator_)._M_dataplus._M_p = 1;
            WriteLevel0Table((DBImpl *)local_170,(MemTable *)log_number,local_198,
                             (Version *)max_sequence);
            pp_Var7 = (this->super_DB)._vptr_DB;
            (this->super_DB)._vptr_DB = (_func_int **)local_170._0_8_;
            local_170._0_8_ = pp_Var7;
            if (pp_Var7 != (_func_int **)0x0) {
              operator_delete__(pp_Var7);
            }
            iVar4 = iVar4 + 1;
            MemTable::Unref((MemTable *)local_198);
            pp_Var7 = (this->super_DB)._vptr_DB;
            local_198 = (VersionEdit *)0x0;
            if (pp_Var7 != (_func_int **)0x0) break;
          }
        }
        bVar2 = log::Reader::ReadRecord((Reader *)(local_d0 + 0x48),&local_e0,&local_120);
        pp_Var7 = (this->super_DB)._vptr_DB;
        if ((!bVar2) || (pp_Var7 != (_func_int **)0x0)) break;
      } while( true );
    }
    if ((Comparator *)local_170._48_8_ != (Comparator *)0x0) {
      (*(*(_func_int ***)local_170._48_8_)[1])();
      pp_Var7 = (this->super_DB)._vptr_DB;
    }
    if ((pp_Var7 == (_func_int **)0x0) &&
       (((byte)local_170._20_4_ & *(byte *)(log_number + 0x880) & iVar4 == 0) == 1)) {
      (**(code **)(**(long **)(log_number + 8) + 0x58))
                (local_170 + 0x18,*(long **)(log_number + 8),&local_100,local_170);
      if ((Comparator *)local_170._24_8_ == (Comparator *)0x0) {
        (**(code **)(**(long **)(log_number + 8) + 0x28))
                  (local_170 + 0x28,*(long **)(log_number + 8),&local_100,log_number + 0x948);
        if ((FilterPolicy *)local_170._40_8_ == (FilterPolicy *)0x0) {
          if ((Comparator *)local_170._24_8_ != (Comparator *)0x0) {
            operator_delete__((void *)local_170._24_8_);
          }
          Log(*(Logger **)(log_number + 0x48),"Reusing old log %s \n",local_100._M_dataplus._M_p);
          this_00 = (Writer *)operator_new(0x20);
          log::Writer::Writer(this_00,*(WritableFile **)(log_number + 0x948),local_170._0_8_);
          *(Writer **)(log_number + 0x958) = this_00;
          *(Logger **)(log_number + 0x950) = local_128;
          if (local_198 == (VersionEdit *)0x0) {
            this_01 = (MemTable *)operator_new(0x70);
            MemTable::MemTable(this_01,(InternalKeyComparator *)(log_number + 0x10));
            *(MemTable **)(log_number + 0x930) = this_01;
            this_01->refs_ = this_01->refs_ + 1;
          }
          else {
            *(VersionEdit **)(log_number + 0x930) = local_198;
          }
          local_198 = (VersionEdit *)0x0;
        }
        else {
          operator_delete__((void *)local_170._40_8_);
          if ((Comparator *)local_170._24_8_ != (Comparator *)0x0) {
            operator_delete__((void *)local_170._24_8_);
          }
        }
      }
      else {
        operator_delete__((void *)local_170._24_8_);
      }
    }
    if (local_198 != (VersionEdit *)0x0) {
      if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
        *(undefined1 *)&(edit->comparator_)._M_dataplus._M_p = 1;
        WriteLevel0Table((DBImpl *)local_170,(MemTable *)log_number,local_198,
                         (Version *)max_sequence);
        pp_Var7 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_170._0_8_;
        local_170._0_8_ = pp_Var7;
        if (pp_Var7 != (_func_int **)0x0) {
          operator_delete__(pp_Var7);
        }
      }
      MemTable::Unref((MemTable *)local_198);
    }
    WriteBatch::~WriteBatch((WriteBatch *)local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                               local_120.field_2._M_local_buf[0]) + 1);
    }
    log::Reader::~Reader((Reader *)(local_d0 + 0x48));
    log::Reader::Reporter::~Reporter((Reporter *)(local_d0 + 0x20));
  }
  else {
    MaybeIgnoreError((DBImpl *)log_number,(Status *)this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::RecoverLogFile(uint64_t log_number, bool last_log,
                              bool* save_manifest, VersionEdit* edit,
                              SequenceNumber* max_sequence) {
  struct LogReporter : public log::Reader::Reporter {
    Env* env;
    Logger* info_log;
    const char* fname;
    Status* status;  // null if options_.paranoid_checks==false
    void Corruption(size_t bytes, const Status& s) override {
      Log(info_log, "%s%s: dropping %d bytes; %s",
          (this->status == nullptr ? "(ignoring error) " : ""), fname,
          static_cast<int>(bytes), s.ToString().c_str());
      if (this->status != nullptr && this->status->ok()) *this->status = s;
    }
  };

  mutex_.AssertHeld();

  // Open the log file
  std::string fname = LogFileName(dbname_, log_number);
  SequentialFile* file;
  Status status = env_->NewSequentialFile(fname, &file);
  if (!status.ok()) {
    MaybeIgnoreError(&status);
    return status;
  }

  // Create the log reader.
  LogReporter reporter;
  reporter.env = env_;
  reporter.info_log = options_.info_log;
  reporter.fname = fname.c_str();
  reporter.status = (options_.paranoid_checks ? &status : nullptr);
  // We intentionally make log::Reader do checksumming even if
  // paranoid_checks==false so that corruptions cause entire commits
  // to be skipped instead of propagating bad information (like overly
  // large sequence numbers).
  log::Reader reader(file, &reporter, true /*checksum*/, 0 /*initial_offset*/);
  Log(options_.info_log, "Recovering log #%llu",
      (unsigned long long)log_number);

  // Read all the records and add to a memtable
  std::string scratch;
  Slice record;
  WriteBatch batch;
  int compactions = 0;
  MemTable* mem = nullptr;
  while (reader.ReadRecord(&record, &scratch) && status.ok()) {
    if (record.size() < 12) {
      reporter.Corruption(record.size(),
                          Status::Corruption("log record too small"));
      continue;
    }
    WriteBatchInternal::SetContents(&batch, record);

    if (mem == nullptr) {
      mem = new MemTable(internal_comparator_);
      mem->Ref();
    }
    status = WriteBatchInternal::InsertInto(&batch, mem);
    MaybeIgnoreError(&status);
    if (!status.ok()) {
      break;
    }
    const SequenceNumber last_seq = WriteBatchInternal::Sequence(&batch) +
                                    WriteBatchInternal::Count(&batch) - 1;
    if (last_seq > *max_sequence) {
      *max_sequence = last_seq;
    }

    if (mem->ApproximateMemoryUsage() > options_.write_buffer_size) {
      compactions++;
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
      mem->Unref();
      mem = nullptr;
      if (!status.ok()) {
        // Reflect errors immediately so that conditions like full
        // file-systems cause the DB::Open() to fail.
        break;
      }
    }
  }

  delete file;

  // See if we should keep reusing the last log file.
  if (status.ok() && options_.reuse_logs && last_log && compactions == 0) {
    assert(logfile_ == nullptr);
    assert(log_ == nullptr);
    assert(mem_ == nullptr);
    uint64_t lfile_size;
    if (env_->GetFileSize(fname, &lfile_size).ok() &&
        env_->NewAppendableFile(fname, &logfile_).ok()) {
      Log(options_.info_log, "Reusing old log %s \n", fname.c_str());
      log_ = new log::Writer(logfile_, lfile_size);
      logfile_number_ = log_number;
      if (mem != nullptr) {
        mem_ = mem;
        mem = nullptr;
      } else {
        // mem can be nullptr if lognum exists but was empty.
        mem_ = new MemTable(internal_comparator_);
        mem_->Ref();
      }
    }
  }

  if (mem != nullptr) {
    // mem did not get reused; compact it.
    if (status.ok()) {
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
    }
    mem->Unref();
  }

  return status;
}